

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_bpf_init_preallocated(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF)

{
  void *in_RDX;
  ma_bool32 in_stack_00000034;
  ma_bpf *in_stack_00000038;
  void *in_stack_00000040;
  ma_bpf_config *in_stack_00000048;
  undefined4 local_14;
  
  if (in_RDX == (void *)0x0) {
    local_14 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (void *)0x0) {
      memset(in_RDX,0,0x28);
    }
    local_14 = ma_bpf_reinit__internal
                         (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000034);
  }
  return local_14;
}

Assistant:

MA_API ma_result ma_bpf_init_preallocated(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF)
{
    if (pBPF == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pBPF);

    return ma_bpf_reinit__internal(pConfig, pHeap, pBPF, /*isNew*/MA_TRUE);
}